

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O0

void sysbvm_function_setupPrimitives(sysbvm_context_t *context)

{
  sysbvm_tuple_t sVar1;
  sysbvm_context_t *context_local;
  
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"apply",2,0x16,(void *)0x0,sysbvm_function_primitive_apply);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).functionType,"applyWithArguments:",2,0x14,(void *)0x0,
             sysbvm_function_primitive_applyWithArguments);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).functionType,"applyWithExpandedArguments:",2,0x14,(void *)0x0,
             sysbvm_function_primitive_applyWithExpandedArguments);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).functionType,"adoptDefinitionOf:",2,4,(void *)0x0,
             sysbvm_function_primitive_adoptDefinitionOf);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).functionType,"isBootstrapPrimitive",1,0x1c,(void *)0x0,
             sysbvm_function_primitive_isBootstrapPrimitive);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).functionType,"hasVirtualDispatch",1,0x1c,(void *)0x0,
             sysbvm_function_primitive_hasVirtualDispatch);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).functionType,"hasOverrideDispatch",1,0x1c,(void *)0x0,
             sysbvm_function_primitive_hasOverrideDispatch);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).functionType,"recompileAndOptimize",1,4,(void *)0x0,
             sysbvm_function_primitive_recompileAndOptimize);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).functionType,"recordBindingWithOwner:andName:",3,0x80,
             (void *)0x0,sysbvm_function_primitive_recordBindingWithOwnerAndName);
  sVar1 = sysbvm_tuple_bitflags_encode(0);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::None",sVar1);
  sVar1 = sysbvm_tuple_bitflags_encode(1);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::Macro",sVar1);
  sVar1 = sysbvm_tuple_bitflags_encode(2);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::Variadic",sVar1);
  sVar1 = sysbvm_tuple_bitflags_encode(4);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionFlags::CorePrimitive",sVar1);
  sVar1 = sysbvm_tuple_bitflags_encode(8);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::Pure",sVar1);
  sVar1 = sysbvm_tuple_bitflags_encode(0x10);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::Final",sVar1);
  sVar1 = sysbvm_tuple_bitflags_encode(0x20);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::Virtual",sVar1);
  sVar1 = sysbvm_tuple_bitflags_encode(0x40);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::Abstract",sVar1);
  sVar1 = sysbvm_tuple_bitflags_encode(0x80);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::Override",sVar1);
  sVar1 = sysbvm_tuple_bitflags_encode(0xe0);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionFlags::VirtualDispatchFlags",sVar1);
  sVar1 = sysbvm_tuple_bitflags_encode(0x100);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::Static",sVar1);
  sVar1 = sysbvm_tuple_bitflags_encode(0x200);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::Memoized",sVar1);
  sVar1 = sysbvm_tuple_bitflags_encode(0x400);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::Template",sVar1);
  sVar1 = sysbvm_tuple_bitflags_encode(0x800);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionFlags::NoTypecheckArguments",sVar1);
  sVar1 = sysbvm_tuple_bitflags_encode(0x1000);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionFlags::AllowReferenceInReceiver",sVar1);
  sVar1 = sysbvm_tuple_bitflags_encode(0x2000);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::ExternC",sVar1);
  sVar1 = sysbvm_tuple_bitflags_encode(0x4000);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::DLLImport",sVar1);
  sVar1 = sysbvm_tuple_bitflags_encode(0x8000);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::DLLExport",sVar1);
  sVar1 = sysbvm_tuple_bitflags_encode(0x10000);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::Inline",sVar1);
  sVar1 = sysbvm_tuple_bitflags_encode(0x10000);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionFlags::AlwaysInline",sVar1);
  sVar1 = sysbvm_tuple_bitflags_encode(0x40000);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::NeverInline",sVar1)
  ;
  sVar1 = sysbvm_tuple_bitflags_encode(0x100000);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionFlags::WithoutSourceDebugging",sVar1);
  sVar1 = sysbvm_tuple_bitflags_encode(0x200000);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::NoGC",sVar1);
  sVar1 = sysbvm_tuple_bitflags_encode(0x400000);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::NoEscape",sVar1);
  sVar1 = sysbvm_tuple_bitflags_encode(0x80000);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionFlags::TargetDefinedPrimitive",sVar1);
  sVar1 = sysbvm_tuple_bitflags_encode(0x8001c);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionFlags::BootstrapPrimitiveKeptFlags",sVar1);
  sVar1 = sysbvm_tuple_bitflags_encode(0x602);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionFlags::TypeFlags",sVar1);
  sVar1 = sysbvm_tuple_bitflags_encode(0);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionApplicationFlags::None",sVar1);
  sVar1 = sysbvm_tuple_bitflags_encode(1);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionApplicationFlags::NoTypecheck",sVar1);
  sVar1 = sysbvm_tuple_bitflags_encode(2);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionApplicationFlags::VariadicExpanded",sVar1);
  return;
}

Assistant:

void sysbvm_function_setupPrimitives(sysbvm_context_t *context)
{
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "apply", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_VARIADIC | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_function_primitive_apply);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.functionType, "applyWithArguments:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_function_primitive_applyWithArguments);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.functionType, "applyWithExpandedArguments:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_function_primitive_applyWithExpandedArguments);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.functionType, "adoptDefinitionOf:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_function_primitive_adoptDefinitionOf);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.functionType, "isBootstrapPrimitive", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_function_primitive_isBootstrapPrimitive);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.functionType, "hasVirtualDispatch", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_function_primitive_hasVirtualDispatch);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.functionType, "hasOverrideDispatch", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_function_primitive_hasOverrideDispatch);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.functionType, "recompileAndOptimize", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_function_primitive_recompileAndOptimize);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.functionType, "recordBindingWithOwner:andName:", 3, SYSBVM_FUNCTION_FLAGS_OVERRIDE, NULL, sysbvm_function_primitive_recordBindingWithOwnerAndName);

    // Export the function flags.
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::None", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_NONE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::Macro", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_MACRO));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::Variadic", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_VARIADIC));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::CorePrimitive", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::Pure", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_PURE));

    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::Final", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_FINAL));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::Virtual", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_VIRTUAL));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::Abstract", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_ABSTRACT));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::Override", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_OVERRIDE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::VirtualDispatchFlags", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_VIRTUAL_DISPATCH_FLAGS));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::Static", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_STATIC));

    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::Memoized", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_MEMOIZED));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::Template", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_TEMPLATE));

    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::NoTypecheckArguments", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_NO_TYPECHECK_ARGUMENTS));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::AllowReferenceInReceiver", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_ALLOW_REFERENCE_IN_RECEIVER));

    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::ExternC", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_EXTERN_C));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::DLLImport", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_DLLIMPORT));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::DLLExport", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_DLLEXPORT));

    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::Inline", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_INLINE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::AlwaysInline", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_INLINE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::NeverInline", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_NEVER_INLINE));

    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::WithoutSourceDebugging", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_WITHOUT_SOURCE_DEBUGGING));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::NoGC", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_NOGC));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::NoEscape", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_NOESCAPE));

    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::TargetDefinedPrimitive", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_TARGET_DEFINED_PRIMITIVE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::BootstrapPrimitiveKeptFlags", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_FLAGS_BOOTSTRAP_PRIMITIVE_KEPT_FLAGS));

    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionFlags::TypeFlags", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_TYPE_FLAGS));

    // Export the function application flags.
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionApplicationFlags::None", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_APPLICATION_FLAGS_NONE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionApplicationFlags::NoTypecheck", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionApplicationFlags::VariadicExpanded", sysbvm_tuple_bitflags_encode(SYSBVM_FUNCTION_APPLICATION_FLAGS_VARIADIC_EXPANDED));
}